

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O3

void __thiscall Js::RootObjectBase::EnsureCanDeclGloFunc(RootObjectBase *this,PropertyId propertyId)

{
  ScriptContext *this_00;
  int iVar1;
  PropertyRecord *pPVar2;
  
  iVar1 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x31])();
  if (iVar1 == 0) {
    iVar1 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x30])(this,propertyId);
    if (iVar1 == 0) {
      iVar1 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x32])(this,propertyId);
      if (iVar1 == 0) {
        this_00 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                    javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
        pPVar2 = ScriptContext::GetPropertyName(this_00,propertyId);
        JavascriptError::ThrowTypeError(this_00,-0x7ff5e9d1,(PCWSTR)(pPVar2 + 1));
      }
    }
  }
  return;
}

Assistant:

void
    RootObjectBase::EnsureCanDeclGloFunc(PropertyId propertyId)
    {
        // #sec-candeclareglobalfunction states that if an exisiting property is
        // not configurable, not writable, and not enumerable, return false.
        if (!IsConfigurable(propertyId) && !IsWritable(propertyId) && !IsEnumerable(propertyId))
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_InvalidGloFuncDecl,
                GetScriptContext()->GetPropertyName(propertyId)->GetBuffer());
        }
    }